

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ripser.cpp
# Opt level: O0

void __thiscall
compressed_distance_matrix<(compressed_matrix_layout)1>::compressed_distance_matrix
          (compressed_distance_matrix<(compressed_matrix_layout)1> *this,
          vector<float,_std::allocator<float>_> *_distances)

{
  long lVar1;
  allocator_type *__n;
  size_type sVar2;
  allocator_type *in_RDI;
  float fVar3;
  float fVar4;
  vector<float,_std::allocator<float>_> *unaff_retaddr;
  undefined4 in_stack_ffffffffffffffd0;
  float local_28;
  
  std::vector<float,_std::allocator<float>_>::vector
            (unaff_retaddr,(vector<float,_std::allocator<float>_> *)in_RDI);
  __n = in_RDI + 0x18;
  sVar2 = std::vector<float,_std::allocator<float>_>::size
                    ((vector<float,_std::allocator<float>_> *)in_RDI);
  lVar1 = sVar2 * 8 + 1;
  fVar3 = (float)lVar1;
  fVar4 = (float)(long)(((sVar2 << 3) >> 1) + 1);
  local_28 = fVar4 + fVar4;
  if (-1 < lVar1) {
    local_28 = fVar3;
  }
  std::sqrt((double)(ulong)(uint)local_28);
  std::allocator<float_*>::allocator((allocator<float_*> *)0x14da63);
  std::vector<float_*,_std::allocator<float_*>_>::vector
            ((vector<float_*,_std::allocator<float_*>_> *)CONCAT44(fVar3,in_stack_ffffffffffffffd0),
             (size_type)__n,in_RDI);
  std::allocator<float_*>::~allocator((allocator<float_*> *)0x14da82);
  init_rows((compressed_distance_matrix<(compressed_matrix_layout)1> *)
            CONCAT44(fVar3,in_stack_ffffffffffffffd0));
  return;
}

Assistant:

compressed_distance_matrix(std::vector<value_t>&& _distances)
	    : distances(_distances), rows(size_t(1 + std::sqrt(value_t(1 + 8 * distances.size()))) / 2) {
		assert(distances.size() == size() * (size() - 1) / 2);
		init_rows();
	}